

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall
TPZFMatrix<long_double>::Substitution
          (TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *B,TPZVec<int> *index)

{
  ostream *poVar1;
  int64_t iVar2;
  void *this_00;
  longdouble *plVar3;
  TPZVec<int> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  longdouble in_ST0;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  TPZVec<long_double> v;
  longdouble sum;
  int64_t j;
  int64_t i;
  int64_t ic;
  int64_t ncols;
  int nRows;
  TPZFMatrix<long_double> *b;
  int64_t in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined6 uStack_168;
  longdouble *in_stack_fffffffffffffea0;
  longdouble *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined6 uStack_148;
  TPZVec<long_double> local_88;
  longdouble local_68;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  int local_2c;
  TPZBaseMatrix *local_28;
  TPZVec<int> *local_20;
  TPZBaseMatrix *local_18;
  
  if (in_RSI == (TPZBaseMatrix *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                            );
    poVar1 = std::operator<<(poVar1,"TPZFMatrix<>*B eh nulo");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (in_RDI->fDecomposed == '\0') {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                            );
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_266cb9);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_28 = in_RSI;
    local_20 = in_RDX;
    local_18 = in_RSI;
    if (in_RDI->fDecomposed != '\x02') {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                              );
      poVar1 = std::operator<<(poVar1,"\nfDecomposed != ELUPivot");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    local_2c = (int)iVar2;
    iVar2 = TPZVec<int>::NElements(local_20);
    if ((iVar2 == local_2c) && (iVar2 = TPZBaseMatrix::Rows(local_28), iVar2 == local_2c)) {
      local_38 = TPZBaseMatrix::Cols(local_18);
      for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
        local_68 = (longdouble)0;
        TPZVec<long_double>::TPZVec
                  ((TPZVec<long_double> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe88);
        for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
          TPZVec<int>::operator[](local_20,local_48);
          plVar3 = operator()((TPZFMatrix<long_double> *)
                              CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                              (int64_t)in_stack_fffffffffffffea8,(int64_t)in_stack_fffffffffffffea0)
          ;
          lVar4 = *plVar3;
          plVar3 = TPZVec<long_double>::operator[](&local_88,local_48);
          *plVar3 = lVar4;
        }
        for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
          local_68 = (longdouble)0;
          for (local_50 = 0; lVar4 = local_68, local_50 < local_48; local_50 = local_50 + 1) {
            (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_48,local_50);
            plVar3 = TPZVec<long_double>::operator[](&local_88,local_50);
            local_68 = in_ST0 * *plVar3 + local_68;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
          }
          plVar3 = TPZVec<long_double>::operator[](&local_88,local_48);
          *plVar3 = *plVar3 - lVar4;
        }
        for (local_48 = (long)(local_2c + -1); -1 < local_48; local_48 = local_48 + -1) {
          local_68 = (longdouble)0;
          lVar4 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          local_50 = local_48;
          while (local_50 = local_50 + 1, local_50 < local_2c) {
            (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_48,local_50);
            plVar3 = TPZVec<long_double>::operator[](&local_88,local_50);
            local_68 = lVar4 * *plVar3 + local_68;
            lVar4 = in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
          }
          plVar3 = TPZVec<long_double>::operator[](&local_88,local_48);
          lVar5 = *plVar3 - local_68;
          in_ST5 = in_ST4;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_48);
          lVar5 = lVar5 / lVar4;
          in_stack_fffffffffffffeb4 = SUB104(lVar5,0);
          uStack_148 = (undefined6)((unkuint10)lVar5 >> 0x20);
          plVar3 = TPZVec<long_double>::operator[](&local_88,local_48);
          *plVar3 = (longdouble)CONCAT64(uStack_148,in_stack_fffffffffffffeb4);
        }
        for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
          in_stack_fffffffffffffea8 = TPZVec<long_double>::operator[](&local_88,local_48);
          in_stack_fffffffffffffe94 = SUB104(*in_stack_fffffffffffffea8,0);
          uStack_168 = (undefined6)((unkuint10)*in_stack_fffffffffffffea8 >> 0x20);
          in_stack_fffffffffffffea0 =
               operator()((TPZFMatrix<long_double> *)
                          CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                          (int64_t)in_stack_fffffffffffffea8,(int64_t)in_stack_fffffffffffffea0);
          *in_stack_fffffffffffffea0 = (longdouble)CONCAT64(uStack_168,in_stack_fffffffffffffe94);
        }
        TPZVec<long_double>::~TPZVec
                  ((TPZVec<long_double> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      }
      return 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_266cdb);
    poVar1 = std::operator<<(poVar1,"this->fIndex = ");
    iVar2 = TPZVec<int>::NElements(local_20);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    poVar1 = std::operator<<(poVar1,"  b = ");
    iVar2 = TPZBaseMatrix::Rows(local_28);
    this_00 = (void *)std::ostream::operator<<(poVar1,iVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B, const TPZVec<int> &index ) const{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    if (!this->fDecomposed){
        PZError <<  __PRETTY_FUNCTION__ << "Matriz não decomposta" << endl;
        return 0;
    }
    
    if (this->fDecomposed != ELUPivot){
        PZError << __PRETTY_FUNCTION__ << "\nfDecomposed != ELUPivot" << endl;
    }
    
    int nRows = this->Rows();
    
    if (index.NElements() != nRows || b.Rows() != nRows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t ncols = B->Cols();
    for(int64_t ic = 0; ic<ncols; ic++)
    {
        int64_t i,j;
        TVar sum = 0;
        
        TPZVec<TVar> v(nRows);
        
        
        for (i=0;i<nRows;i++)
        {
            v[i] = b(index[i],ic);
        }
        
        //Ly=b
        for (i=0;i<nRows;i++)
        {
            sum = 0.;
            for (j=0;j<(i);j++) sum +=this->Get(i,j) * v[j];
            v[i] -= sum;
        }
        
        //Ux=y
        for (i=(nRows-1);i>-1;i--)
        {
            sum = 0.;
            for (j=(i+1);j<nRows;j++) sum += this->Get(i,j) * v[j];
            v[i] = (v[i] - sum) / this->Get(i,i);
        }
        
        for (i=0;i<nRows;i++) b(i,ic) = v[i];
    }
    return 1;
}